

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aws_command_runner_test.cc
# Opt level: O0

void __thiscall AwsCommandRunner_CopyFile_Test::TestBody(AwsCommandRunner_CopyFile_Test *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  bool bVar1;
  MockSpec<void_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
  *pMVar2;
  TypedExpectation<void_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
  *pTVar3;
  MockSpec<bool_()> *pMVar4;
  TypedExpectation<bool_()> *pTVar5;
  char *pcVar6;
  char *in_R9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_790;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_710;
  string local_698;
  AssertHelper local_678;
  Message local_670;
  bool local_661;
  undefined1 local_660 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_630;
  Message local_628;
  bool local_619;
  undefined1 local_618 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_5e8;
  Message local_5e0;
  bool local_5d1;
  undefined1 local_5d0 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_5a0;
  Message local_598;
  bool local_589;
  undefined1 local_588 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_558;
  Message local_550;
  bool local_541;
  undefined1 local_540 [8];
  AssertionResult gtest_ar__1;
  string local_528;
  AssertHelper local_508;
  Message local_500;
  bool local_4f1;
  undefined1 local_4f0 [8];
  AssertionResult gtest_ar_;
  string local_4d8;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4b8;
  allocator local_481;
  string local_480;
  allocator local_459;
  string local_458;
  undefined1 local_438 [8];
  AwsCommandRunner aws_command_runner;
  Action<bool_()> local_3b0;
  ReturnAction<bool> local_3a0;
  Action<bool_()> local_390;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_37f;
  undefined1 local_37e;
  allocator local_37d;
  allocator local_37c;
  allocator local_37b;
  allocator local_37a;
  allocator local_379;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  string local_350 [32];
  string local_330 [32];
  string local_310 [32];
  string local_2f0 [32];
  iterator local_2d0;
  size_type local_2c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2c0;
  Matcher<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
  local_2a8;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28f;
  undefined1 local_28e;
  allocator local_28d;
  allocator local_28c;
  allocator local_28b;
  allocator local_28a;
  allocator local_289;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  string local_260 [32];
  string local_240 [32];
  string local_220 [32];
  string local_200 [32];
  iterator local_1e0;
  size_type local_1d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1d0;
  Matcher<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
  local_1b8;
  undefined1 local_190 [8];
  MultipleCommandRunner multiple_command_runner;
  MockCommandRunner command_runner;
  AwsCommandRunner_CopyFile_Test *this_local;
  
  anon_unknown.dwarf_e710::MockCommandRunner::MockCommandRunner
            ((MockCommandRunner *)&multiple_command_runner.ignore_failures_for_current_command_);
  MultipleCommandRunner::MultipleCommandRunner
            ((MultipleCommandRunner *)local_190,
             (CommandRunner *)&multiple_command_runner.ignore_failures_for_current_command_);
  local_28e = 1;
  local_288 = &local_280;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_280,"aws",&local_289);
  local_288 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_260,"s3",&local_28a);
  local_288 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_240;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_240,"rm",&local_28b);
  local_288 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_220;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_220,"--recursive",&local_28c);
  local_288 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_200;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_200,"s3://bucket/foo",&local_28d);
  local_28e = 0;
  local_1e0 = &local_280;
  local_1d8 = 5;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_28f);
  __l_00._M_len = local_1d8;
  __l_00._M_array = local_1e0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_1d0,__l_00,&local_28f);
  testing::
  Matcher<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
  ::Matcher(&local_1b8,&local_1d0);
  pMVar2 = anon_unknown.dwarf_e710::MockCommandRunner::gmock_RunCommand
                     ((MockCommandRunner *)
                      &multiple_command_runner.ignore_failures_for_current_command_,&local_1b8);
  pTVar3 = testing::internal::
           MockSpec<void_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
           ::InternalExpectedAt
                     (pMVar2,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kumina[P]awssyncer/src/aws_command_runner_test.cc"
                      ,0x3c,"command_runner",
                      "RunCommand(std::vector<std::string>({ \"aws\", \"s3\", \"rm\", \"--recursive\", \"s3://bucket/foo\", }))"
                     );
  testing::internal::
  TypedExpectation<void_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
  ::Times(pTVar3,1);
  testing::
  Matcher<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
  ::~Matcher(&local_1b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1d0);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_28f);
  local_710 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1e0;
  do {
    local_710 = local_710 + -1;
    std::__cxx11::string::~string((string *)local_710);
  } while (local_710 != &local_280);
  std::allocator<char>::~allocator((allocator<char> *)&local_28d);
  std::allocator<char>::~allocator((allocator<char> *)&local_28c);
  std::allocator<char>::~allocator((allocator<char> *)&local_28b);
  std::allocator<char>::~allocator((allocator<char> *)&local_28a);
  std::allocator<char>::~allocator((allocator<char> *)&local_289);
  local_37e = 1;
  local_378 = &local_370;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_370,"aws",&local_379);
  local_378 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_350;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_350,"s3",&local_37a);
  local_378 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_330;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_330,"cp",&local_37b);
  local_378 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_310;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_310,"/tmp/foo",&local_37c);
  local_378 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2f0,"s3://bucket/foo",&local_37d);
  local_37e = 0;
  local_2d0 = &local_370;
  local_2c8 = 5;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_37f);
  __l._M_len = local_2c8;
  __l._M_array = local_2d0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_2c0,__l,&local_37f);
  testing::
  Matcher<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
  ::Matcher(&local_2a8,&local_2c0);
  pMVar2 = anon_unknown.dwarf_e710::MockCommandRunner::gmock_RunCommand
                     ((MockCommandRunner *)
                      &multiple_command_runner.ignore_failures_for_current_command_,&local_2a8);
  pTVar3 = testing::internal::
           MockSpec<void_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
           ::InternalExpectedAt
                     (pMVar2,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kumina[P]awssyncer/src/aws_command_runner_test.cc"
                      ,0x41,"command_runner",
                      "RunCommand(std::vector<std::string>({ \"aws\", \"s3\", \"cp\", \"/tmp/foo\", \"s3://bucket/foo\", }))"
                     );
  testing::internal::
  TypedExpectation<void_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
  ::Times(pTVar3,1);
  testing::
  Matcher<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
  ::~Matcher(&local_2a8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2c0);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_37f);
  local_790 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2d0;
  do {
    local_790 = local_790 + -1;
    std::__cxx11::string::~string((string *)local_790);
  } while (local_790 != &local_370);
  std::allocator<char>::~allocator((allocator<char> *)&local_37d);
  std::allocator<char>::~allocator((allocator<char> *)&local_37c);
  std::allocator<char>::~allocator((allocator<char> *)&local_37b);
  std::allocator<char>::~allocator((allocator<char> *)&local_37a);
  std::allocator<char>::~allocator((allocator<char> *)&local_379);
  pMVar4 = anon_unknown.dwarf_e710::MockCommandRunner::gmock_Finished
                     ((MockCommandRunner *)
                      &multiple_command_runner.ignore_failures_for_current_command_);
  pTVar5 = testing::internal::MockSpec<bool_()>::InternalExpectedAt
                     (pMVar4,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kumina[P]awssyncer/src/aws_command_runner_test.cc"
                      ,0x43,"command_runner","Finished()");
  testing::Return<bool>((testing *)&local_3a0,true);
  testing::internal::ReturnAction::operator_cast_to_Action((ReturnAction *)&local_390);
  testing::internal::TypedExpectation<bool_()>::WillRepeatedly(pTVar5,&local_390);
  testing::Action<bool_()>::~Action(&local_390);
  testing::internal::ReturnAction<bool>::~ReturnAction(&local_3a0);
  pMVar4 = anon_unknown.dwarf_e710::MockCommandRunner::gmock_PreviousCommandFailed
                     ((MockCommandRunner *)
                      &multiple_command_runner.ignore_failures_for_current_command_);
  pTVar5 = testing::internal::MockSpec<bool_()>::InternalExpectedAt
                     (pMVar4,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kumina[P]awssyncer/src/aws_command_runner_test.cc"
                      ,0x44,"command_runner","PreviousCommandFailed()");
  testing::Return<bool>
            ((testing *)
             &aws_command_runner.sync_excludes_._M_t._M_impl.super__Rb_tree_header._M_node_count,
             false);
  testing::internal::ReturnAction::operator_cast_to_Action((ReturnAction *)&local_3b0);
  testing::internal::TypedExpectation<bool_()>::WillRepeatedly(pTVar5,&local_3b0);
  testing::Action<bool_()>::~Action(&local_3b0);
  testing::internal::ReturnAction<bool>::~ReturnAction
            ((ReturnAction<bool> *)
             &aws_command_runner.sync_excludes_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_458,"/tmp/",&local_459);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_480,"bucket",&local_481);
  local_4b8._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_4b8._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_4b8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_4b8._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_4b8._M_t._M_impl._0_8_ = 0;
  local_4b8._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_4b8._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&local_4b8);
  AwsCommandRunner::AwsCommandRunner
            ((AwsCommandRunner *)local_438,(MultipleCommandRunner *)local_190,&local_458,&local_480,
             &local_4b8);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set(&local_4b8);
  std::__cxx11::string::~string((string *)&local_480);
  std::allocator<char>::~allocator((allocator<char> *)&local_481);
  std::__cxx11::string::~string((string *)&local_458);
  std::allocator<char>::~allocator((allocator<char> *)&local_459);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_4d8,"/tmp/foo",(allocator *)((long)&gtest_ar_.message_.ptr_ + 7));
  AwsCommandRunner::CopyFile((AwsCommandRunner *)local_438,&local_4d8);
  std::__cxx11::string::~string((string *)&local_4d8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_.message_.ptr_ + 7));
  bVar1 = AwsCommandRunner::Finished((AwsCommandRunner *)local_438);
  local_4f1 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_4f0,&local_4f1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4f0);
  if (!bVar1) {
    testing::Message::Message(&local_500);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_528,(internal *)local_4f0,(AssertionResult *)"aws_command_runner.Finished()",
               "true","false",in_R9);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_508,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kumina[P]awssyncer/src/aws_command_runner_test.cc"
               ,0x4b,pcVar6);
    testing::internal::AssertHelper::operator=(&local_508,&local_500);
    testing::internal::AssertHelper::~AssertHelper(&local_508);
    std::__cxx11::string::~string((string *)&local_528);
    testing::Message::~Message(&local_500);
  }
  gtest_ar__1.message_.ptr_._5_3_ = 0;
  gtest_ar__1.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4f0);
  if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
    bVar1 = AwsCommandRunner::PreviousCommandFailed((AwsCommandRunner *)local_438);
    local_541 = (bool)(~bVar1 & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_540,&local_541,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_540);
    if (!bVar1) {
      testing::Message::Message(&local_550);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__2.message_,(internal *)local_540,
                 (AssertionResult *)"aws_command_runner.PreviousCommandFailed()","true","false",
                 in_R9);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_558,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kumina[P]awssyncer/src/aws_command_runner_test.cc"
                 ,0x4c,pcVar6);
      testing::internal::AssertHelper::operator=(&local_558,&local_550);
      testing::internal::AssertHelper::~AssertHelper(&local_558);
      std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
      testing::Message::~Message(&local_550);
    }
    gtest_ar__1.message_.ptr_._5_3_ = 0;
    gtest_ar__1.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_540);
    if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
      bVar1 = AwsCommandRunner::Finished((AwsCommandRunner *)local_438);
      local_589 = (bool)(~bVar1 & 1);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_588,&local_589,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_588);
      if (!bVar1) {
        testing::Message::Message(&local_598);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__3.message_,(internal *)local_588,
                   (AssertionResult *)"aws_command_runner.Finished()","true","false",in_R9);
        pcVar6 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_5a0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kumina[P]awssyncer/src/aws_command_runner_test.cc"
                   ,0x4d,pcVar6);
        testing::internal::AssertHelper::operator=(&local_5a0,&local_598);
        testing::internal::AssertHelper::~AssertHelper(&local_5a0);
        std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
        testing::Message::~Message(&local_598);
      }
      gtest_ar__1.message_.ptr_._5_3_ = 0;
      gtest_ar__1.message_.ptr_._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_588);
      if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
        bVar1 = AwsCommandRunner::PreviousCommandFailed((AwsCommandRunner *)local_438);
        local_5d1 = (bool)(~bVar1 & 1);
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_5d0,&local_5d1,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5d0);
        if (!bVar1) {
          testing::Message::Message(&local_5e0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__4.message_,(internal *)local_5d0,
                     (AssertionResult *)"aws_command_runner.PreviousCommandFailed()","true","false",
                     in_R9);
          pcVar6 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_5e8,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kumina[P]awssyncer/src/aws_command_runner_test.cc"
                     ,0x4e,pcVar6);
          testing::internal::AssertHelper::operator=(&local_5e8,&local_5e0);
          testing::internal::AssertHelper::~AssertHelper(&local_5e8);
          std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
          testing::Message::~Message(&local_5e0);
        }
        gtest_ar__1.message_.ptr_._5_3_ = 0;
        gtest_ar__1.message_.ptr_._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_5d0);
        if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
          local_619 = AwsCommandRunner::Finished((AwsCommandRunner *)local_438);
          testing::AssertionResult::AssertionResult<bool>
                    ((AssertionResult *)local_618,&local_619,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_618);
          if (!bVar1) {
            testing::Message::Message(&local_628);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar__5.message_,(internal *)local_618,
                       (AssertionResult *)"aws_command_runner.Finished()","false","true",in_R9);
            pcVar6 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_630,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kumina[P]awssyncer/src/aws_command_runner_test.cc"
                       ,0x4f,pcVar6);
            testing::internal::AssertHelper::operator=(&local_630,&local_628);
            testing::internal::AssertHelper::~AssertHelper(&local_630);
            std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
            testing::Message::~Message(&local_628);
          }
          gtest_ar__1.message_.ptr_._5_3_ = 0;
          gtest_ar__1.message_.ptr_._4_1_ = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_618);
          if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
            bVar1 = AwsCommandRunner::PreviousCommandFailed((AwsCommandRunner *)local_438);
            local_661 = (bool)(~bVar1 & 1);
            testing::AssertionResult::AssertionResult<bool>
                      ((AssertionResult *)local_660,&local_661,(type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_660);
            if (!bVar1) {
              testing::Message::Message(&local_670);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        (&local_698,(internal *)local_660,
                         (AssertionResult *)"aws_command_runner.PreviousCommandFailed()","true",
                         "false",in_R9);
              pcVar6 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_678,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kumina[P]awssyncer/src/aws_command_runner_test.cc"
                         ,0x50,pcVar6);
              testing::internal::AssertHelper::operator=(&local_678,&local_670);
              testing::internal::AssertHelper::~AssertHelper(&local_678);
              std::__cxx11::string::~string((string *)&local_698);
              testing::Message::~Message(&local_670);
            }
            gtest_ar__1.message_.ptr_._5_3_ = 0;
            gtest_ar__1.message_.ptr_._4_1_ = !bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_660);
            if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
              gtest_ar__1.message_.ptr_._4_4_ = 0;
            }
          }
        }
      }
    }
  }
  AwsCommandRunner::~AwsCommandRunner((AwsCommandRunner *)local_438);
  MultipleCommandRunner::~MultipleCommandRunner((MultipleCommandRunner *)local_190);
  anon_unknown.dwarf_e710::MockCommandRunner::~MockCommandRunner
            ((MockCommandRunner *)&multiple_command_runner.ignore_failures_for_current_command_);
  return;
}

Assistant:

TEST(AwsCommandRunner, CopyFile) {
  MockCommandRunner command_runner;
  MultipleCommandRunner multiple_command_runner(&command_runner);
  EXPECT_CALL(command_runner,
              RunCommand(std::vector<std::string>({
                  "aws", "s3", "rm", "--recursive", "s3://bucket/foo",
              })))
      .Times(1);
  EXPECT_CALL(command_runner,
              RunCommand(std::vector<std::string>({
                  "aws", "s3", "cp", "/tmp/foo", "s3://bucket/foo",
              })))
      .Times(1);
  EXPECT_CALL(command_runner, Finished()).WillRepeatedly(Return(true));
  EXPECT_CALL(command_runner, PreviousCommandFailed())
      .WillRepeatedly(Return(false));

  AwsCommandRunner aws_command_runner(&multiple_command_runner, "/tmp/",
                                      "bucket", {});
  aws_command_runner.CopyFile("/tmp/foo");

  ASSERT_FALSE(aws_command_runner.Finished());
  ASSERT_FALSE(aws_command_runner.PreviousCommandFailed());
  ASSERT_FALSE(aws_command_runner.Finished());
  ASSERT_FALSE(aws_command_runner.PreviousCommandFailed());
  ASSERT_TRUE(aws_command_runner.Finished());
  ASSERT_FALSE(aws_command_runner.PreviousCommandFailed());
}